

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RbuState * rbuLoadState(sqlite3rbu *p)

{
  sqlite3 *db;
  sqlite3_stmt *pStmt_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  RbuState *pRVar4;
  char *pcVar5;
  uchar *puVar6;
  ulong uVar7;
  sqlite3_int64 sVar8;
  int local_3c;
  sqlite3_stmt *pStmt;
  
  pStmt = (sqlite3_stmt *)0x0;
  pRVar4 = (RbuState *)rbuMalloc(p,0x50);
  if (pRVar4 != (RbuState *)0x0) {
    db = p->dbRbu;
    pcVar5 = sqlite3_mprintf("SELECT k, v FROM %s.rbu_state",p->zStateDb);
    local_3c = prepareFreeAndCollectError(db,&pStmt,&p->zErrmsg,pcVar5);
    pStmt_00 = pStmt;
    while ((iVar2 = local_3c, local_3c == 0 && (iVar1 = sqlite3_step(pStmt_00), iVar1 == 100))) {
      iVar2 = sqlite3_column_int(pStmt_00,0);
      switch(iVar2) {
      case 1:
        uVar3 = sqlite3_column_int(pStmt_00,1);
        pRVar4->eStage = uVar3;
        if ((4 < uVar3) || ((0x16U >> (uVar3 & 0x1f) & 1) == 0)) {
          p->rc = 0xb;
        }
        break;
      case 2:
        puVar6 = sqlite3_column_text(pStmt_00,1);
        pcVar5 = rbuStrndup((char *)puVar6,&local_3c);
        pRVar4->zTbl = pcVar5;
        break;
      case 3:
        puVar6 = sqlite3_column_text(pStmt_00,1);
        pcVar5 = rbuStrndup((char *)puVar6,&local_3c);
        pRVar4->zIdx = pcVar5;
        break;
      case 4:
        iVar2 = sqlite3_column_int(pStmt_00,1);
        pRVar4->nRow = iVar2;
        break;
      case 5:
        sVar8 = sqlite3_column_int64(pStmt_00,1);
        pRVar4->nProgress = sVar8;
        break;
      case 6:
        sVar8 = sqlite3_column_int64(pStmt_00,1);
        pRVar4->iWalCksum = sVar8;
        break;
      case 7:
        sVar8 = sqlite3_column_int64(pStmt_00,1);
        pRVar4->iCookie = (u32)sVar8;
        break;
      case 8:
        uVar7 = sqlite3_column_int64(pStmt_00,1);
        pRVar4->iOalSz = uVar7 & 0xffffffff;
        break;
      case 9:
        sVar8 = sqlite3_column_int64(pStmt_00,1);
        pRVar4->nPhaseOneStep = sVar8;
        break;
      case 10:
        puVar6 = sqlite3_column_text(pStmt_00,1);
        pcVar5 = rbuStrndup((char *)puVar6,&local_3c);
        pRVar4->zDataTbl = pcVar5;
        break;
      default:
        local_3c = 0xb;
      }
    }
    iVar1 = sqlite3_finalize(pStmt_00);
    if (iVar2 != 0) {
      iVar1 = iVar2;
    }
    p->rc = iVar1;
  }
  return pRVar4;
}

Assistant:

static RbuState *rbuLoadState(sqlite3rbu *p){
  RbuState *pRet = 0;
  sqlite3_stmt *pStmt = 0;
  int rc;
  int rc2;

  pRet = (RbuState*)rbuMalloc(p, sizeof(RbuState));
  if( pRet==0 ) return 0;

  rc = prepareFreeAndCollectError(p->dbRbu, &pStmt, &p->zErrmsg, 
      sqlite3_mprintf("SELECT k, v FROM %s.rbu_state", p->zStateDb)
  );
  while( rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pStmt) ){
    switch( sqlite3_column_int(pStmt, 0) ){
      case RBU_STATE_STAGE:
        pRet->eStage = sqlite3_column_int(pStmt, 1);
        if( pRet->eStage!=RBU_STAGE_OAL
         && pRet->eStage!=RBU_STAGE_MOVE
         && pRet->eStage!=RBU_STAGE_CKPT
        ){
          p->rc = SQLITE_CORRUPT;
        }
        break;

      case RBU_STATE_TBL:
        pRet->zTbl = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      case RBU_STATE_IDX:
        pRet->zIdx = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      case RBU_STATE_ROW:
        pRet->nRow = sqlite3_column_int(pStmt, 1);
        break;

      case RBU_STATE_PROGRESS:
        pRet->nProgress = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_CKPT:
        pRet->iWalCksum = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_COOKIE:
        pRet->iCookie = (u32)sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_OALSZ:
        pRet->iOalSz = (u32)sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_PHASEONESTEP:
        pRet->nPhaseOneStep = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_DATATBL:
        pRet->zDataTbl = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      default:
        rc = SQLITE_CORRUPT;
        break;
    }
  }
  rc2 = sqlite3_finalize(pStmt);
  if( rc==SQLITE_OK ) rc = rc2;

  p->rc = rc;
  return pRet;
}